

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBToRGB24Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar2;
  }
  for (; (int)uVar3 != (int)uVar2; uVar2 = uVar2 + 1) {
    uVar1 = src_argb[uVar2 * 4 + 2];
    *(undefined2 *)dst_rgb = *(undefined2 *)(src_argb + uVar2 * 4);
    dst_rgb[2] = uVar1;
    dst_rgb = dst_rgb + 3;
  }
  return;
}

Assistant:

void ARGBToRGB24Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb[0];
    uint8_t g = src_argb[1];
    uint8_t r = src_argb[2];
    dst_rgb[0] = b;
    dst_rgb[1] = g;
    dst_rgb[2] = r;
    dst_rgb += 3;
    src_argb += 4;
  }
}